

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Reference(Vector *this,Value *value)

{
  buffer_ptr<VectorBuffer> *this_00;
  PhysicalType PVar1;
  bool bVar2;
  templated_unique_single_t tVar3;
  child_list_t<LogicalType> *this_01;
  pointer pVVar4;
  const_reference pvVar5;
  vector<duckdb::Value,_true> *this_02;
  const_reference other;
  VectorBuffer *pVVar6;
  ulong __n;
  templated_unique_single_t list_buffer;
  templated_unique_single_t vector;
  Value local_88;
  LogicalType local_48;
  
  this->vector_type = CONSTANT_VECTOR;
  VectorBuffer::CreateConstantVector((VectorBuffer *)&local_88,&value->type_);
  this_00 = &this->buffer;
  shared_ptr<duckdb::VectorBuffer,_true>::operator=
            (this_00,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_);
  PVar1 = (value->type_).physical_type_;
  if (PVar1 == LIST) {
    make_uniq<duckdb::VectorListBuffer,duckdb::LogicalType_const&>
              ((duckdb *)&list_buffer,&value->type_);
    tVar3 = list_buffer;
    list_buffer.
    super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>._M_t.
    super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
    .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl =
         (unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>)
         (__uniq_ptr_data<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true,_true>
          )0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorListBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_88,
               (VectorListBuffer *)
               tVar3.
               super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
               .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_);
    pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
    this->data = (pVVar6->data).pointer;
    SetValue(this,0,value);
  }
  else if (PVar1 == ARRAY) {
    make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&>
              ((duckdb *)&list_buffer,&value->type_);
    tVar3 = list_buffer;
    list_buffer.
    super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>._M_t.
    super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
    .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl =
         (unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>)
         (__uniq_ptr_data<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true,_true>
          )0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorArrayBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_88,
               (VectorArrayBuffer *)
               tVar3.
               super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
               .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_);
    SetValue(this,0,value);
  }
  else {
    if (PVar1 != STRUCT) {
      ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&this->auxiliary)
      ;
      pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
      this->data = (pVVar6->data).pointer;
      SetValue(this,0,value);
      return;
    }
    make_uniq<duckdb::VectorStructBuffer>();
    this_01 = StructType::GetChildTypes_abi_cxx11_(&value->type_);
    pVVar4 = unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
             ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                           *)&list_buffer);
    for (__n = 0; tVar3.
                  super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
                  .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl =
                       list_buffer.
                       super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
                       .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl,
        __n < (ulong)(((long)(this_01->
                             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_01->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); __n = __n + 1) {
      bVar2 = value->is_null;
      if (bVar2 == true) {
        pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::get<true>(this_01,__n);
        LogicalType::LogicalType(&local_48,&pvVar5->second);
        Value::Value(&local_88,&local_48);
      }
      else {
        this_02 = StructValue::GetChildren(value);
        other = vector<duckdb::Value,_true>::get<true>(this_02,__n);
        Value::Value(&local_88,other);
      }
      make_uniq<duckdb::Vector,duckdb::Value_const>((duckdb *)&vector,&local_88);
      Value::~Value(&local_88);
      if (bVar2 != false) {
        LogicalType::~LogicalType(&local_48);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                  *)&pVVar4->children,
                 (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&vector);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&vector);
    }
    list_buffer.
    super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>._M_t.
    super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
    .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl =
         (unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>)
         (__uniq_ptr_data<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true,_true>
          )0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorStructBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_88,
               (VectorStructBuffer *)
               tVar3.
               super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
               .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_);
    if (value->is_null == true) {
      SetValue(this,0,value);
    }
  }
  if (list_buffer.
      super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
      .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)list_buffer.
                          super_unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::VectorListBuffer_*,_std::default_delete<duckdb::VectorListBuffer>_>
                          .super__Head_base<0UL,_duckdb::VectorListBuffer_*,_false>._M_head_impl + 8
                ))();
  }
  return;
}

Assistant:

void Vector::Reference(const Value &value) {
	D_ASSERT(GetType().id() == value.type().id());
	this->vector_type = VectorType::CONSTANT_VECTOR;
	buffer = VectorBuffer::CreateConstantVector(value.type());
	auto internal_type = value.type().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>();
		auto &child_types = StructType::GetChildTypes(value.type());
		auto &child_vectors = struct_buffer->GetChildren();
		for (idx_t i = 0; i < child_types.size(); i++) {
			auto vector =
			    make_uniq<Vector>(value.IsNull() ? Value(child_types[i].second) : StructValue::GetChildren(value)[i]);
			child_vectors.push_back(std::move(vector));
		}
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
		if (value.IsNull()) {
			SetValue(0, value);
		}
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
		data = buffer->GetData();
		SetValue(0, value);
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
		SetValue(0, value);
	} else {
		auxiliary.reset();
		data = buffer->GetData();
		SetValue(0, value);
	}
}